

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void make_size(png_store *ps,png_byte colour_type,int bdlo,int bdhi)

{
  byte bVar1;
  undefined4 local_24;
  undefined4 local_20;
  png_uint_32 height;
  png_uint_32 width;
  int bdhi_local;
  int bdlo_local;
  png_byte colour_type_local;
  png_store *ps_local;
  
  for (width = bdlo; (int)width <= bdhi; width = width + 1) {
    for (local_20 = 1; local_20 < 0x11; local_20 = local_20 + 1) {
      for (local_24 = 1; local_24 < 0x11; local_24 = local_24 + 1) {
        bVar1 = (byte)width;
        make_size_image(ps,colour_type,(png_byte)(1 << (bVar1 & 0x1f)),0,local_20,local_24,0);
        make_size_image(ps,colour_type,(png_byte)(1 << (bVar1 & 0x1f)),0,local_20,local_24,1);
        make_size_image(ps,colour_type,(png_byte)(1 << (bVar1 & 0x1f)),1,local_20,local_24,0);
        make_size_image(ps,colour_type,(png_byte)(1 << (bVar1 & 0x1f)),1,local_20,local_24,1);
      }
    }
  }
  return;
}

Assistant:

static void
make_size(png_store* const ps, png_byte const colour_type, int bdlo,
    int const bdhi)
{
   for (; bdlo <= bdhi; ++bdlo)
   {
      png_uint_32 width;

      for (width = 1; width <= 16; ++width)
      {
         png_uint_32 height;

         for (height = 1; height <= 16; ++height)
         {
            /* The four combinations of DIY interlace and interlace or not -
             * no interlace + DIY should be identical to no interlace with
             * libpng doing it.
             */
            make_size_image(ps, colour_type, DEPTH(bdlo), PNG_INTERLACE_NONE,
               width, height, 0);
            make_size_image(ps, colour_type, DEPTH(bdlo), PNG_INTERLACE_NONE,
               width, height, 1);
#        ifdef PNG_WRITE_INTERLACING_SUPPORTED
            make_size_image(ps, colour_type, DEPTH(bdlo), PNG_INTERLACE_ADAM7,
               width, height, 0);
#        endif
#        if CAN_WRITE_INTERLACE
            /* 1.7.0 removes the hack that prevented app write of an interlaced
             * image if WRITE_INTERLACE was not supported
             */
            make_size_image(ps, colour_type, DEPTH(bdlo), PNG_INTERLACE_ADAM7,
               width, height, 1);
#        endif
         }
      }
   }
}